

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

HighsInt __thiscall HFactor::buildKernel(HFactor *this)

{
  double dVar1;
  value_type vVar2;
  value_type vVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  size_t __nbytes;
  size_type sVar14;
  size_t in_RDI;
  double extraout_XMM0_Qa;
  HighsInt iRow_4;
  HighsInt i_7;
  HighsInt i_6;
  HighsInt i_5;
  HighsInt p3_1;
  HighsInt p2_1;
  HighsInt p1_1;
  HighsInt iRow_3;
  HighsInt i_4;
  HighsInt iRow_2;
  HighsInt i_3;
  HighsInt p7;
  HighsInt p5;
  HighsInt p4;
  HighsInt p3;
  HighsInt p2;
  HighsInt p1;
  HighsInt my_k_1;
  HighsInt new_end;
  double value_1;
  HighsInt iRow_1;
  HighsInt my_k;
  HighsInt nCancel;
  HighsInt nFillin;
  double my_pivot;
  HighsInt my_end;
  HighsInt my_start;
  HighsInt my_count;
  HighsInt iCol;
  HighsInt row_k;
  HighsInt row_end;
  HighsInt row_start;
  HighsInt i_2;
  HighsInt start_N;
  HighsInt end_N;
  double value;
  HighsInt iRow;
  HighsInt k_2;
  HighsInt mwz_column_count;
  HighsInt end_A;
  HighsInt start_A;
  double pivot_multiplier;
  HighsInt ifind;
  double merit_local_1;
  HighsInt column_count;
  HighsInt j_1;
  HighsInt k_1;
  HighsInt end_1;
  HighsInt start_1;
  HighsInt i_1;
  double merit_local;
  HighsInt row_count;
  HighsInt i;
  HighsInt k;
  HighsInt end;
  HighsInt start;
  double min_pivot;
  HighsInt j;
  HighsInt count;
  HighsInt max_count;
  bool singleton_pivot;
  bool foundPivot;
  double merit_pivot;
  double merit_limit;
  HighsInt searchCount;
  HighsInt searchLimit;
  HighsInt iRowPivot;
  HighsInt jColPivot;
  double total_time_bound;
  double remaining_time_bound;
  HighsInt iterations_left;
  double iteration_time;
  double time_difference;
  double current_time;
  HighsInt check_nwork;
  HighsInt search_k;
  bool check_for_timeout;
  double average_iteration_time;
  double previous_iteration_time;
  HighsInt timer_frequency;
  HighsInt progress_frequency;
  bool progress_report;
  double fake_eliminate;
  double fake_fill;
  double fake_search;
  int in_stack_fffffffffffffc88;
  value_type in_stack_fffffffffffffc8c;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  HFactor *in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcac;
  HFactor *in_stack_fffffffffffffcb0;
  HighsInt in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  HFactor *in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  bool local_211;
  bool local_201;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1bc;
  int local_1b4;
  int local_198;
  int local_194;
  value_type local_190;
  int local_184;
  int local_180;
  int local_17c;
  double local_178;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  undefined4 local_154;
  int local_150;
  int local_14c;
  int local_148;
  undefined4 local_144;
  value_type local_140;
  value_type local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  HighsLogOptions *local_120;
  int local_114;
  double local_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  double local_f0;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  value_type local_d0;
  int local_c8;
  int local_c4;
  int local_c0;
  byte local_ba;
  bool local_b9;
  double local_b8;
  double local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  double local_90;
  double local_88;
  int local_7c;
  int local_78 [2];
  double local_70;
  double local_68;
  double local_60;
  undefined4 local_54;
  int local_50;
  byte local_49;
  double local_48;
  double local_40;
  int local_34;
  undefined4 local_30;
  undefined1 local_29;
  double local_28;
  double local_20;
  double local_18;
  
  local_18 = 0.0;
  local_20 = 0.0;
  local_28 = 0.0;
  local_29 = 0;
  local_30 = 10000;
  local_34 = 100;
  local_40 = 0.0;
  local_48 = 0.0;
  local_49 = *(double *)(in_RDI + 0x120) <= INFINITY && *(double *)(in_RDI + 0x120) != INFINITY;
  local_50 = 0;
  local_54 = 0xfffffff5;
  do {
    iVar5 = *(int *)(in_RDI + 0x1a8);
    *(int *)(in_RDI + 0x1a8) = iVar5 + -1;
    if (iVar5 < 1) {
      *(double *)(in_RDI + 8) =
           local_28 * 80.0 + local_18 * 20.0 + local_20 * 160.0 + *(double *)(in_RDI + 8);
      *(undefined4 *)(in_RDI + 0x10) = 0;
      return *(HighsInt *)(in_RDI + 0x10);
    }
    __nbytes = in_RDI;
    if (*(int *)(in_RDI + 0x1a8) == -0xb) {
      reportAsm((HFactor *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    }
    if (((local_49 & 1) != 0) && ((int)((long)local_50 % (long)local_34) == 0)) {
      HighsTimer::read(*(HighsTimer **)(in_RDI + 0x1a0),0,
                       (void *)((long)local_50 % (long)local_34 & 0xffffffff),__nbytes);
      local_68 = extraout_XMM0_Qa - local_40;
      local_70 = local_68 / ((double)local_34 * 1.0);
      local_48 = local_48 * 0.9 + local_70 * 0.1;
      local_60 = extraout_XMM0_Qa;
      local_40 = extraout_XMM0_Qa;
      if (*(double *)(in_RDI + 0x120) / 1000.0 < local_68) {
        local_78[1] = 1;
        local_78[0] = local_34 / 10;
        piVar10 = std::max<int>(local_78 + 1,local_78);
        local_34 = *piVar10;
      }
      local_7c = (*(int *)(in_RDI + 0xc0) - local_50) + 1;
      local_88 = local_48 * (double)local_7c;
      local_90 = local_60 + local_88;
      if ((*(double *)(in_RDI + 0x120) <= local_60 && local_60 != *(double *)(in_RDI + 0x120)) ||
         (*(double *)(in_RDI + 0x120) <= local_90 && local_90 != *(double *)(in_RDI + 0x120))) {
        return -1;
      }
    }
    local_94 = -1;
    local_98 = -1;
    local_a0 = 8;
    piVar10 = std::min<int>((int *)(in_RDI + 0x1a8),&local_a0);
    local_9c = *piVar10;
    local_a4 = 0;
    local_b8 = (double)*(int *)(in_RDI + 0xd0) * 1.0 * (double)*(int *)(in_RDI + 200);
    local_50 = local_50 + 1;
    local_b9 = false;
    local_b0 = local_b8;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3d8),1);
    if (*pvVar11 != -1) {
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3d8),1);
      local_94 = *pvVar11;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),(long)local_94);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),(long)*pvVar11);
      local_98 = *pvVar11;
      local_b9 = true;
    }
    if (((local_b9 & 1U) == 0) &&
       (pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x420),1),
       *pvVar11 != -1)) {
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x420),1);
      local_98 = *pvVar11;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x318),(long)local_98);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x378),(long)*pvVar11);
      local_94 = *pvVar11;
      local_b9 = true;
    }
    local_ba = local_b9 & 1;
    piVar10 = std::max<int>((int *)(in_RDI + 200),(int *)(in_RDI + 0xd0));
    local_c0 = *piVar10;
    for (local_c4 = 2; (local_b9 & 1U) == 0 && local_c4 <= local_c0; local_c4 = local_c4 + 1) {
      if (local_c4 <= *(int *)(in_RDI + 200)) {
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3d8),(long)local_c4);
        local_c8 = *pvVar11;
        while (local_c8 != -1) {
          pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x300),
                               (long)local_c8);
          local_d0 = *pvVar12;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),(long)local_c8)
          ;
          iVar5 = *pvVar11;
          local_d4 = iVar5;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x288),(long)local_c8)
          ;
          local_d8 = iVar5 + *pvVar11;
          for (local_dc = local_d4; local_dc < local_d8; local_dc = local_dc + 1) {
            pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2e8),
                                 (long)local_dc);
            if (local_d0 <= ABS(*pvVar12)) {
              pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),
                                   (long)local_dc);
              local_e0 = *pvVar11;
              pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x330),
                                   (long)local_e0);
              local_e4 = *pvVar11;
              local_f0 = (double)(local_c4 + -1) * 1.0 * (double)(local_e4 + -1);
              if (local_f0 < local_b8) {
                local_94 = local_c8;
                local_98 = local_e0;
                local_201 = (local_b9 & 1U) != 0 || local_e4 < local_c4;
                local_b9 = local_201;
                local_b8 = local_f0;
              }
            }
          }
          iVar5 = local_a4 + 1;
          if ((local_9c <= local_a4) && (local_b8 < local_b0)) {
            local_b9 = true;
          }
          local_a4 = iVar5;
          if ((local_b9 & 1U) != 0) break;
          local_18 = (double)local_c4 + local_18;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3f0),(long)local_c8)
          ;
          local_c8 = *pvVar11;
        }
      }
      if (local_c4 <= *(int *)(in_RDI + 0xd0)) {
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x420),(long)local_c4);
        local_f4 = *pvVar11;
        while (local_f4 != -1) {
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x318),(long)local_f4)
          ;
          iVar5 = *pvVar11;
          local_f8 = iVar5;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x330),(long)local_f4)
          ;
          local_fc = iVar5 + *pvVar11;
          for (local_100 = local_f8; local_100 < local_fc; local_100 = local_100 + 1) {
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x378),
                                 (long)local_100);
            local_104 = *pvVar11;
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x288),
                                 (long)local_104);
            local_108 = *pvVar11;
            local_110 = (double)(local_c4 + -1) * 1.0 * (double)(local_108 + -1);
            if (local_110 < local_b8) {
              pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),
                                   (long)local_104);
              local_114 = *pvVar11;
              while (pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),
                                          (long)local_114), *pvVar11 != local_f4) {
                local_114 = local_114 + 1;
              }
              pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2e8),
                                   (long)local_114);
              dVar1 = *pvVar12;
              pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x300),
                                   (long)local_104);
              if (*pvVar12 <= ABS(dVar1)) {
                local_b8 = local_110;
                local_94 = local_104;
                local_98 = local_f4;
                local_211 = (local_b9 & 1U) != 0 || local_108 <= local_c4;
                local_b9 = local_211;
              }
            }
          }
          iVar5 = local_a4 + 1;
          if ((local_9c <= local_a4) && (local_b8 < local_b0)) {
            local_b9 = true;
          }
          local_a4 = iVar5;
          if ((local_b9 & 1U) != 0) break;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x438),(long)local_f4)
          ;
          local_f4 = *pvVar11;
        }
        local_18 = (double)local_c4 + local_18;
      }
    }
    if (local_98 < 0) {
      *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x1a8) + 1;
      highsLogDev((HighsLogOptions *)(in_RDI + 0x130),kWarning,
                  "Factorization identifies rank deficiency of %d\n",(ulong)*(uint *)(in_RDI + 0x10)
                 );
      return *(HighsInt *)(in_RDI + 0x10);
    }
    local_120 = (HighsLogOptions *)
                colDelete(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,
                          in_stack_fffffffffffffcb8);
    rowDelete(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8);
    clinkDel(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    rlinkDel(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    iVar5 = local_98;
    if (*(double *)(in_RDI + 0x110) <= ABS((double)local_120)) {
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x240),(long)local_94);
      *pvVar11 = iVar5;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      std::vector<signed_char,_std::allocator<signed_char>_>::push_back
                ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_fffffffffffffca0,
                 (value_type_conflict *)
                 CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),(long)local_94);
      iVar5 = *pvVar11;
      local_124 = iVar5;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x288),(long)local_94);
      local_128 = iVar5 + *pvVar11;
      local_12c = 0;
      for (local_130 = local_124; local_130 < local_128; local_130 = local_130 + 1) {
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),(long)local_130);
        local_134 = *pvVar11;
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2e8),
                             (long)local_130);
        vVar3 = local_134;
        local_140 = *pvVar12 / (double)local_120;
        sVar14 = (size_type)local_12c;
        local_12c = local_12c + 1;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x390),sVar14);
        vVar2 = local_140;
        *pvVar11 = vVar3;
        pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x3c0),
                             (long)local_134);
        *pvVar12 = vVar2;
        pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x3a8),(long)local_134
                            );
        *pvVar13 = '\x01';
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                   (value_type_conflict1 *)
                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x330),(long)local_134);
        vVar3 = *pvVar11;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x360),(long)local_134);
        *pvVar11 = vVar3;
        rowDelete(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8);
      }
      sVar14 = std::vector<int,_std::allocator<int>_>::size
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x4b0));
      local_144 = (undefined4)sVar14;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc90,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x288),(long)local_94);
      iVar4 = local_124;
      local_20 = (double)(*pvVar11 << 1) + local_20;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2b8),(long)local_94);
      iVar5 = *pvVar11;
      local_148 = iVar4 + iVar5;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2a0),(long)local_94);
      local_150 = (iVar4 + iVar5) - *pvVar11;
      local_14c = local_150;
      for (; local_150 < local_148; local_150 = local_150 + 1) {
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),(long)local_150);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                   (value_type_conflict2 *)
                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2e8),(long)local_150);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                   (value_type_conflict1 *)
                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      }
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffca0,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0,
                 (value_type_conflict1 *)
                 CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
      sVar14 = std::vector<int,_std::allocator<int>_>::size
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5a8));
      local_154 = (undefined4)sVar14;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc90,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      local_20 = (double)(local_148 - local_14c) + local_20;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x318),(long)local_98);
      iVar5 = *pvVar11;
      local_158 = iVar5;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x330),(long)local_98);
      local_15c = iVar5 + *pvVar11;
      for (local_160 = local_158; local_160 < local_15c; local_160 = local_160 + 1) {
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x378),(long)local_160);
        local_164 = *pvVar11;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x288),(long)local_164);
        local_168 = *pvVar11;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),(long)local_164);
        local_16c = *pvVar11;
        local_170 = local_16c + local_168 + -1;
        local_178 = colDelete(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,
                              in_stack_fffffffffffffcb8);
        colStoreN(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8,
                  (double)in_stack_fffffffffffffcb0);
        local_17c = local_12c;
        local_180 = 0;
        for (local_184 = local_16c; local_184 < local_170; local_184 = local_184 + 1) {
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),(long)local_184
                              );
          iVar5 = *pvVar11;
          pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2e8),
                               (long)local_184);
          local_190 = *pvVar12;
          pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x3a8),(long)iVar5);
          if (*pvVar13 != '\0') {
            pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                                ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x3a8),(long)iVar5
                                );
            dVar1 = local_178;
            *pvVar13 = '\0';
            local_17c = local_17c + -1;
            pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x3c0),
                                 (long)iVar5);
            local_190 = -dVar1 * *pvVar12 + local_190;
            if (ABS(local_190) < 1e-14) {
              local_190 = 0.0;
              local_180 = local_180 + 1;
            }
            pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2e8),
                                 (long)local_184);
            *pvVar12 = local_190;
          }
        }
        local_28 = (double)(local_17c << 1) + (double)local_12c + local_28;
        if (0 < local_180) {
          local_194 = local_16c;
          for (local_198 = local_16c; local_198 < local_170; local_198 = local_198 + 1) {
            pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2e8),
                                 (long)local_198);
            if ((*pvVar12 != 0.0) || (NAN(*pvVar12))) {
              pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),
                                   (long)local_198);
              vVar3 = *pvVar11;
              pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),
                                   (long)local_194);
              *pvVar11 = vVar3;
              pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2e8),
                                   (long)local_198);
              vVar2 = *pvVar12;
              pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2e8),
                                   (long)local_194);
              *pvVar12 = vVar2;
              local_194 = local_194 + 1;
            }
            else {
              std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),(long)local_198);
              rowDelete(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
                        in_stack_fffffffffffffca8);
            }
          }
          local_194 = local_194 - local_16c;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x288),(long)local_164
                              );
          *pvVar11 = local_194;
        }
        if (0 < local_17c) {
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x288),(long)local_164
                              );
          iVar5 = *pvVar11;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2a0),(long)local_164
                              );
          iVar5 = iVar5 + *pvVar11 + local_17c;
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2b8),(long)local_164
                              );
          if (*pvVar11 < iVar5) {
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),
                                 (long)local_164);
            iVar5 = *pvVar11;
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x288),
                                 (long)local_164);
            iVar4 = *pvVar11;
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2b8),
                                 (long)local_164);
            iVar9 = *pvVar11;
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2a0),
                                 (long)local_164);
            iVar6 = (iVar5 + iVar9) - *pvVar11;
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2b8),
                                 (long)local_164);
            iVar9 = *pvVar11;
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2b8),
                                 (long)local_164);
            piVar10 = std::max<int>(pvVar11,&local_17c);
            iVar8 = *piVar10;
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2b8),
                                 (long)local_164);
            *pvVar11 = iVar8 + *pvVar11;
            sVar14 = std::vector<int,_std::allocator<int>_>::size
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0));
            iVar7 = (int)sVar14;
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x270),
                                 (long)local_164);
            *pvVar11 = iVar7;
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2b8),
                                 (long)local_164);
            iVar8 = *pvVar11;
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2a0),
                                 (long)local_164);
            iVar8 = (iVar7 + iVar8) - *pvVar11;
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2b8),(long)local_164);
            std::vector<int,_std::allocator<int>_>::resize
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb0,
                       CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2b8),(long)local_164);
            std::vector<double,_std::allocator<double>_>::resize
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcb0,
                       CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),(long)iVar5);
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),(long)(iVar5 + iVar4));
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),(long)iVar7);
            std::copy<int*,int*>
                      ((int *)in_stack_fffffffffffffca0,
                       (int *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                       (int *)in_stack_fffffffffffffc90);
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2e8),(long)iVar5);
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2e8),
                       (long)(iVar5 + iVar4));
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2e8),(long)iVar7);
            std::copy<double*,double*>
                      (&in_stack_fffffffffffffca0->build_realTick,
                       (double *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                       (double *)in_stack_fffffffffffffc90);
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),(long)iVar6);
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),(long)(iVar5 + iVar9));
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),(long)iVar8);
            std::copy<int*,int*>
                      ((int *)in_stack_fffffffffffffca0,
                       (int *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                       (int *)in_stack_fffffffffffffc90);
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2e8),(long)iVar6);
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2e8),
                       (long)(iVar5 + iVar9));
            std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2e8),(long)iVar8);
            std::copy<double*,double*>
                      (&in_stack_fffffffffffffca0->build_realTick,
                       (double *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                       (double *)in_stack_fffffffffffffc90);
          }
          for (local_1b4 = 0; local_1b4 < local_12c; local_1b4 = local_1b4 + 1) {
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x390),
                                 (long)local_1b4);
            iVar5 = *pvVar11;
            pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                                ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x3a8),(long)iVar5
                                );
            if (*pvVar13 != '\0') {
              in_stack_fffffffffffffce0 = local_164;
              std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x3c0),(long)iVar5);
              colInsert(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
                        in_stack_fffffffffffffca8,(double)in_stack_fffffffffffffca0);
              in_stack_fffffffffffffce4 = iVar5;
            }
          }
          for (local_1bc = 0; local_1bc < local_12c; local_1bc = local_1bc + 1) {
            pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x390),
                                 (long)local_1bc);
            iVar5 = *pvVar11;
            pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                                ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x3a8),(long)iVar5
                                );
            if (*pvVar13 != '\0') {
              pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x330),(long)iVar5
                                  );
              iVar4 = *pvVar11;
              pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x348),(long)iVar5
                                  );
              if (iVar4 == *pvVar11) {
                pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x318),
                                     (long)iVar5);
                iVar4 = *pvVar11;
                in_stack_fffffffffffffca8 = iVar4;
                pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x330),
                                     (long)iVar5);
                iVar9 = in_stack_fffffffffffffca8 + *pvVar11;
                sVar14 = std::vector<int,_std::allocator<int>_>::size
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x378));
                iVar8 = (int)sVar14;
                pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x318),
                                     (long)iVar5);
                *pvVar11 = iVar8;
                in_stack_fffffffffffffcac = iVar8;
                pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x348),
                                     (long)iVar5);
                *pvVar11 = *pvVar11 << 1;
                in_stack_fffffffffffffcb0 = (HFactor *)(in_RDI + 0x378);
                in_stack_fffffffffffffcbc = iVar8;
                std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x348),(long)iVar5);
                std::vector<int,_std::allocator<int>_>::resize
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb0,
                           CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8));
                in_stack_fffffffffffffcc0 =
                     (HFactor *)
                     std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x378),(long)iVar4);
                std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x378),(long)iVar9);
                std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x378),(long)iVar8);
                std::copy<int*,int*>
                          ((int *)in_stack_fffffffffffffca0,
                           (int *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                           (int *)in_stack_fffffffffffffc90);
              }
              rowInsert(in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c,
                        in_stack_fffffffffffffc98);
            }
          }
        }
        for (local_1d0 = 0; local_1d0 < local_12c; local_1d0 = local_1d0 + 1) {
          in_stack_fffffffffffffca0 = (HFactor *)(in_RDI + 0x3a8);
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x390),(long)local_1d0
                              );
          pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffca0,
                               (long)*pvVar11);
          *pvVar13 = '\x01';
        }
        colFixMax(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        in_stack_fffffffffffffc9c = local_168;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x288),(long)local_164);
        if (in_stack_fffffffffffffc9c != *pvVar11) {
          clinkDel(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
          in_stack_fffffffffffffc98 = local_164;
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x288),(long)local_164);
          clinkAdd(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8);
        }
      }
      for (local_1d4 = 0; local_1d4 < local_12c; local_1d4 = local_1d4 + 1) {
        in_stack_fffffffffffffc90 = (vector<char,_std::allocator<char>_> *)(in_RDI + 0x3a8);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x390),(long)local_1d4);
        pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                            (in_stack_fffffffffffffc90,(long)*pvVar11);
        *pvVar13 = '\0';
      }
      for (local_1d8 = local_124; local_1d8 < local_128; local_1d8 = local_1d8 + 1) {
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2d0),(long)local_1d8);
        iVar5 = *pvVar11;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x360),(long)iVar5);
        in_stack_fffffffffffffc8c = *pvVar11;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x330),(long)iVar5);
        if (in_stack_fffffffffffffc8c != *pvVar11) {
          rlinkDel(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x330),(long)iVar5);
          rlinkAdd(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8);
          in_stack_fffffffffffffc88 = iVar5;
        }
      }
    }
    else {
      highsLogDev(local_120,(HighsLogType)(in_RDI + 0x130),(char *)0x4,
                  "Defer singular pivot = %11.4g\n");
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x330),(long)local_98);
      if (*pvVar11 == 0) {
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x288),(long)local_94);
        clinkAdd(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8);
      }
      else {
        zeroCol(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc);
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x330),(long)local_98);
        rlinkAdd(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca8);
      }
      *(int *)(in_RDI + 0x1a8) = *(int *)(in_RDI + 0x1a8) + 1;
    }
  } while( true );
}

Assistant:

HighsInt HFactor::buildKernel() {
  // Deal with the kernel part by 'n-work' pivoting

  double fake_search = 0;
  double fake_fill = 0;
  double fake_eliminate = 0;

  const bool progress_report = false;  // num_basic != num_row;
  const HighsInt progress_frequency = 10000;
  // Initial timer frequency: may be reduced if iterations get slow
  HighsInt timer_frequency = 100;
  double previous_iteration_time = 0;
  double average_iteration_time = 0;
  const bool check_for_timeout = this->time_limit_ < kHighsInf;
  HighsInt search_k = 0;

  const HighsInt check_nwork = -11;
  while (nwork-- > 0) {
    //    printf("\nnwork = %d\n", (int)nwork);
    if (nwork == check_nwork) {
      reportAsm();
    }
    // Determine whether to return due to exceeding the time limit
    if (check_for_timeout && search_k % timer_frequency == 0) {
      double current_time = build_timer_->read();
      double time_difference = current_time - previous_iteration_time;
      previous_iteration_time = current_time;
      double iteration_time = time_difference / (1.0 * timer_frequency);
      average_iteration_time =
          0.9 * average_iteration_time + 0.1 * iteration_time;

      if (time_difference > this->time_limit_ / 1e3)
        timer_frequency = std::max(HighsInt(1), timer_frequency / 10);
      HighsInt iterations_left = kernel_dim - search_k + 1;
      double remaining_time_bound = average_iteration_time * iterations_left;
      double total_time_bound = current_time + remaining_time_bound;
      if (current_time > this->time_limit_ ||
          total_time_bound > this->time_limit_)
        return kBuildKernelReturnTimeout;
    }

    /**
     * 1. Search for the pivot
     */
    HighsInt jColPivot = -1;
    HighsInt iRowPivot = -1;
    //    int8_t pivot_type = kPivotIllegal;
    // 1.1. Setup search merits
    HighsInt searchLimit = min(nwork, HighsInt{8});
    HighsInt searchCount = 0;

    double merit_limit = 1.0 * num_basic * num_row;
    double merit_pivot = merit_limit;

    if (progress_report && search_k) {
      if (search_k % progress_frequency == 0) {
        HighsInt min_col_count = kHighsIInf;
        HighsInt min_row_count = kHighsIInf;
        for (HighsInt count = 1; count < num_row; count++) {
          if (col_link_first[count] >= 0) {
            min_col_count = count;
            break;
          }
        }
        for (HighsInt count = 1; count < num_basic; count++) {
          if (row_link_first[count] >= 0) {
            min_row_count = count;
            break;
          }
        }
        printf(
            "HFactor::buildKernel stage = %6d: min_col_count = %3d; "
            "min_row_count = %3d\n",
            (int)search_k, (int)min_col_count, (int)min_row_count);
      }
    }
    search_k++;
    // 1.2. Search for local singletons
    bool foundPivot = false;
    //    jColPivot = col_link_first[1];
    if (!foundPivot && col_link_first[1] != -1) {
      // Not yet found a pivot and there is at least one column
      // singleton
      jColPivot = col_link_first[1];
      iRowPivot = mc_index[mc_start[jColPivot]];
      foundPivot = true;
    }
    if (!foundPivot && row_link_first[1] != -1) {
      iRowPivot = row_link_first[1];
      jColPivot = mr_index[mr_start[iRowPivot]];
      foundPivot = true;
    }
    const bool singleton_pivot = foundPivot;
#ifndef NDEBUG
    double candidate_pivot_value = 0;
#endif
    // 1.3. Major search loop
    //
    // Row count can be more than the number of rows if num_basic >
    // num_row
    const HighsInt max_count = max(num_row, num_basic);
    for (HighsInt count = 2; !foundPivot && count <= max_count; count++) {
      // Column count cannot exceed the number of rows
      if (count <= num_row) {
        // 1.3.1 Search for columns
        for (HighsInt j = col_link_first[count]; j != -1;
             j = col_link_next[j]) {
          double min_pivot = mc_min_pivot[j];
          HighsInt start = mc_start[j];
          HighsInt end = start + mc_count_a[j];
          for (HighsInt k = start; k < end; k++) {
            if (fabs(mc_value[k]) >= min_pivot) {
              HighsInt i = mc_index[k];
              HighsInt row_count = mr_count[i];
              double merit_local = 1.0 * (count - 1) * (row_count - 1);
              if (merit_pivot > merit_local) {
#ifndef NDEBUG
                candidate_pivot_value = fabs(mc_value[k]);
#endif
                merit_pivot = merit_local;
                jColPivot = j;
                iRowPivot = i;
                foundPivot = foundPivot || (row_count < count);
              }
            }
          }

          if (searchCount++ >= searchLimit && merit_pivot < merit_limit)
            foundPivot = true;
          if (foundPivot) break;

          fake_search += count;
        }
      }

      // Row count cannot exceed the number of basic variables
      if (count <= num_basic) {
        // 1.3.2 Search for rows
        for (HighsInt i = row_link_first[count]; i != -1;
             i = row_link_next[i]) {
          HighsInt start = mr_start[i];
          HighsInt end = start + mr_count[i];
          for (HighsInt k = start; k < end; k++) {
            HighsInt j = mr_index[k];
            HighsInt column_count = mc_count_a[j];
            double merit_local = 1.0 * (count - 1) * (column_count - 1);
            if (merit_local < merit_pivot) {
              HighsInt ifind = mc_start[j];
              while (mc_index[ifind] != i) ifind++;
              if (fabs(mc_value[ifind]) >= mc_min_pivot[j]) {
#ifndef NDEBUG
                candidate_pivot_value = fabs(mc_value[ifind]);
#endif
                merit_pivot = merit_local;
                jColPivot = j;
                iRowPivot = i;
                foundPivot = foundPivot || (column_count <= count);
              }
            }
          }
          if (searchCount++ >= searchLimit && merit_pivot < merit_limit)
            foundPivot = true;
          if (foundPivot) break;
        }

        fake_search += count;
      }
    }
    // 1.4. If we found nothing: tell singular
    if (iRowPivot < 0) {
      // To detect the absence of a pivot, it should be sufficient
      // that iRowPivot is (still) -1, but add sanity asserts that
      // jColPivot is (still) -1 and foundPivot is false
      assert(jColPivot < 0);
      assert(!foundPivot);
      rank_deficiency = nwork + 1;
      highsLogDev(log_options, HighsLogType::kWarning,
                  "Factorization identifies rank deficiency of %d\n",
                  (int)rank_deficiency);
      return rank_deficiency;
    }

    /**
     * 2. Elimination other elements by the pivot
     */
#ifndef NDEBUG
    const HighsInt original_pivotal_row_count = mr_count[iRowPivot];
    const HighsInt original_pivotal_col_count = mc_count_a[jColPivot];
#endif
    // 2.1. Delete the pivot
    //
    // Remove the pivot row index from the pivotal column of the
    // col-wise matrix. Also decreases the column count
    double pivot_multiplier = colDelete(jColPivot, iRowPivot);
    // Remove the pivot column index from the pivotal row of the
    // row-wise matrix. Also decreases the row count
    rowDelete(jColPivot, iRowPivot);
    // Remove the pivotal column from the linked list of columns
    // containing it
    clinkDel(jColPivot);
    // Remove the pivotal row from the linked list of rows containing
    // it
    rlinkDel(iRowPivot);
    if (!singleton_pivot)
      assert(candidate_pivot_value == fabs(pivot_multiplier));
    if (fabs(pivot_multiplier) < pivot_tolerance) {
      highsLogDev(log_options, HighsLogType::kWarning,
                  "Defer singular pivot = %11.4g\n", pivot_multiplier);
      // Matrix is singular, but defer return since other valid pivots
      // may exist.
      assert(mr_count[iRowPivot] == original_pivotal_row_count - 1);
      if (mr_count[iRowPivot] == 0) {
        // The pivot corresponds to a singleton row. Entry is zeroed,
        // and do no more since there may be other valid entries in
        // the pivotal column
        //
        // Add the pivotal column to the linked list of columns with
        // its new count
        assert(mc_count_a[jColPivot] == original_pivotal_col_count - 1);
        clinkAdd(jColPivot, mc_count_a[jColPivot]);
      } else {
        // Otherwise, other entries in the pivotal column will be
        // smaller than the pivot, so zero the column
        zeroCol(jColPivot);
        // Add the pivotal row to the linked list of rows with its new
        // count
        assert(mr_count[iRowPivot] == original_pivotal_row_count - 1);
        rlinkAdd(iRowPivot, mr_count[iRowPivot]);
      }
      // No pivot found, so have to increment nwork
      nwork++;
      continue;
    }
    permute[jColPivot] = iRowPivot;
    assert(mc_var[jColPivot] == basic_index[jColPivot]);

    this->refactor_info_.pivot_row.push_back(iRowPivot);
    this->refactor_info_.pivot_var.push_back(basic_index[jColPivot]);
    this->refactor_info_.pivot_type.push_back(kPivotMarkowitz);

    // 2.2. Store active pivot column to L
    HighsInt start_A = mc_start[jColPivot];
    HighsInt end_A = start_A + mc_count_a[jColPivot];
    HighsInt mwz_column_count = 0;
    for (HighsInt k = start_A; k < end_A; k++) {
      const HighsInt iRow = mc_index[k];
      const double value = mc_value[k] / pivot_multiplier;
      mwz_column_index[mwz_column_count++] = iRow;
      mwz_column_array[iRow] = value;
      mwz_column_mark[iRow] = 1;
      l_index.push_back(iRow);
      l_value.push_back(value);
      mr_count_before[iRow] = mr_count[iRow];
      rowDelete(jColPivot, (int)iRow);
    }
    l_start.push_back(l_index.size());
    fake_fill += 2 * mc_count_a[jColPivot];

    // 2.3. Store non active pivot column to U
    HighsInt end_N = start_A + mc_space[jColPivot];
    HighsInt start_N = end_N - mc_count_n[jColPivot];
    for (HighsInt i = start_N; i < end_N; i++) {
      u_index.push_back(mc_index[i]);
      u_value.push_back(mc_value[i]);
    }
    u_pivot_index.push_back(iRowPivot);
    u_pivot_value.push_back(pivot_multiplier);
    u_start.push_back(u_index.size());
    fake_fill += end_N - start_N;

    // 2.4. Loop over pivot row to eliminate other column
    const HighsInt row_start = mr_start[iRowPivot];
    const HighsInt row_end = row_start + mr_count[iRowPivot];
    for (HighsInt row_k = row_start; row_k < row_end; row_k++) {
      // 2.4.1. My pointer
      HighsInt iCol = mr_index[row_k];
      const HighsInt my_count = mc_count_a[iCol];
      const HighsInt my_start = mc_start[iCol];
      const HighsInt my_end = my_start + my_count - 1;
      double my_pivot = colDelete(iCol, iRowPivot);
      colStoreN(iCol, iRowPivot, my_pivot);

      // 2.4.2. Elimination on the overlapping part
      HighsInt nFillin = mwz_column_count;
      HighsInt nCancel = 0;
      for (HighsInt my_k = my_start; my_k < my_end; my_k++) {
        HighsInt iRow = mc_index[my_k];
        double value = mc_value[my_k];
        if (mwz_column_mark[iRow]) {
          mwz_column_mark[iRow] = 0;
          nFillin--;
          value -= my_pivot * mwz_column_array[iRow];
          if (fabs(value) < kHighsTiny) {
            value = 0;
            nCancel++;
          }
          mc_value[my_k] = value;
        }
      }
      fake_eliminate += mwz_column_count;
      fake_eliminate += nFillin * 2;

      // 2.4.3. Remove cancellation gaps
      if (nCancel > 0) {
        HighsInt new_end = my_start;
        for (HighsInt my_k = my_start; my_k < my_end; my_k++) {
          if (mc_value[my_k] != 0) {
            mc_index[new_end] = mc_index[my_k];
            mc_value[new_end++] = mc_value[my_k];
          } else {
            rowDelete(iCol, mc_index[my_k]);
          }
        }
        mc_count_a[iCol] = new_end - my_start;
      }

      // 2.4.4. Insert fill-in
      if (nFillin > 0) {
        // 2.4.4.1 Check column size
        if (mc_count_a[iCol] + mc_count_n[iCol] + nFillin > mc_space[iCol]) {
          // p1&2=active, p3&4=non active, p5=new p1, p7=new p3
          HighsInt p1 = mc_start[iCol];
          HighsInt p2 = p1 + mc_count_a[iCol];
          HighsInt p3 = p1 + mc_space[iCol] - mc_count_n[iCol];
          HighsInt p4 = p1 + mc_space[iCol];
          mc_space[iCol] += max(mc_space[iCol], nFillin);
          HighsInt p5 = mc_start[iCol] = mc_index.size();
          HighsInt p7 = p5 + mc_space[iCol] - mc_count_n[iCol];
          mc_index.resize(p5 + mc_space[iCol]);
          mc_value.resize(p5 + mc_space[iCol]);
          copy(&mc_index[p1], &mc_index[p2], &mc_index[p5]);
          copy(&mc_value[p1], &mc_value[p2], &mc_value[p5]);
          copy(&mc_index[p3], &mc_index[p4], &mc_index[p7]);
          copy(&mc_value[p3], &mc_value[p4], &mc_value[p7]);
        }

        // 2.4.4.2 Fill into column copy
        for (HighsInt i = 0; i < mwz_column_count; i++) {
          HighsInt iRow = mwz_column_index[i];
          if (mwz_column_mark[iRow])
            colInsert(iCol, iRow, -my_pivot * mwz_column_array[iRow]);
        }

        // 2.4.4.3 Fill into the row copy
        for (HighsInt i = 0; i < mwz_column_count; i++) {
          HighsInt iRow = mwz_column_index[i];
          if (mwz_column_mark[iRow]) {
            // Expand row space
            if (mr_count[iRow] == mr_space[iRow]) {
              HighsInt p1 = mr_start[iRow];
              HighsInt p2 = p1 + mr_count[iRow];
              HighsInt p3 = mr_start[iRow] = mr_index.size();
              mr_space[iRow] *= 2;
              mr_index.resize(p3 + mr_space[iRow]);
              copy(&mr_index[p1], &mr_index[p2], &mr_index[p3]);
            }
            rowInsert(iCol, iRow);
          }
        }
      }

      // 2.4.5. Reset pivot column mark
      for (HighsInt i = 0; i < mwz_column_count; i++)
        mwz_column_mark[mwz_column_index[i]] = 1;

      // 2.4.6. Fix max value and link list
      colFixMax(iCol);
      if (my_count != mc_count_a[iCol]) {
        clinkDel(iCol);
        clinkAdd(iCol, mc_count_a[iCol]);
      }
    }

    // 2.5. Clear pivot column buffer
    for (HighsInt i = 0; i < mwz_column_count; i++)
      mwz_column_mark[mwz_column_index[i]] = 0;

    // 2.6. Correct row links for the remain active part
    for (HighsInt i = start_A; i < end_A; i++) {
      HighsInt iRow = mc_index[i];
      if (mr_count_before[iRow] != mr_count[iRow]) {
        rlinkDel(iRow);
        rlinkAdd(iRow, mr_count[iRow]);
      }
    }
  }
  build_synthetic_tick +=
      fake_search * 20 + fake_fill * 160 + fake_eliminate * 80;
  rank_deficiency = 0;
  return rank_deficiency;
}